

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetCursorPos(GLFWwindow *handle,double xpos,double ypos)

{
  int iVar1;
  _GLFWwindow *in_RDI;
  double in_XMM0_Qa;
  char *in_XMM1_Qa;
  _GLFWwindow *unaff_retaddr;
  _GLFWwindow *window;
  _GLFWwindow *x;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((((in_XMM0_Qa < -1.79769313486232e+308) || (1.79769313486232e+308 < in_XMM0_Qa)) ||
           ((double)in_XMM1_Qa < -1.79769313486232e+308)) ||
          (1.79769313486232e+308 < (double)in_XMM1_Qa)) {
    _glfwInputError((int)in_XMM0_Qa,in_XMM1_Qa,0x10004,"Invalid cursor position %f %f");
  }
  else {
    x = in_RDI;
    iVar1 = _glfwPlatformWindowFocused(in_RDI);
    if (iVar1 != 0) {
      if (in_RDI->cursorMode == 0x34003) {
        in_RDI->virtualCursorPosX = in_XMM0_Qa;
        in_RDI->virtualCursorPosY = (double)in_XMM1_Qa;
      }
      else {
        _glfwPlatformSetCursorPos(unaff_retaddr,(double)x,in_XMM0_Qa);
      }
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetCursorPos(GLFWwindow* handle, double xpos, double ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (xpos != xpos || xpos < -DBL_MAX || xpos > DBL_MAX ||
        ypos != ypos || ypos < -DBL_MAX || ypos > DBL_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid cursor position %f %f",
                        xpos, ypos);
        return;
    }

    if (!_glfwPlatformWindowFocused(window))
        return;

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        // Only update the accumulated position if the cursor is disabled
        window->virtualCursorPosX = xpos;
        window->virtualCursorPosY = ypos;
    }
    else
    {
        // Update system cursor position
        _glfwPlatformSetCursorPos(window, xpos, ypos);
    }
}